

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O1

void __thiscall
helics::Endpoint::Endpoint(Endpoint *this,MessageFederate *mFed,string_view name,string_view type)

{
  pointer pcVar1;
  pointer pcVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Endpoint *pEVar10;
  
  pEVar10 = helics::MessageFederate::registerEndpoint(mFed,(string_view)name,(string_view)type);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Interface_004ca6f0;
  (this->super_Interface).mCore = (pEVar10->super_Interface).mCore;
  (this->super_Interface).handle.hid = (pEVar10->super_Interface).handle.hid;
  (this->super_Interface).mName._M_dataplus._M_p = (pointer)&(this->super_Interface).mName.field_2;
  pcVar1 = (pEVar10->super_Interface).mName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Interface).mName,pcVar1,
             pcVar1 + (pEVar10->super_Interface).mName._M_string_length);
  (this->super_Interface)._vptr_Interface = (_func_int **)&PTR__Endpoint_004c9f78;
  uVar3 = *(undefined4 *)((long)&pEVar10->fed + 4);
  iVar4 = pEVar10->referenceIndex;
  uVar5 = *(undefined4 *)&pEVar10->field_0x44;
  uVar6 = *(undefined4 *)((long)&pEVar10->referenceIndex + 2);
  uVar7 = *(undefined4 *)&pEVar10->field_0x46;
  uVar8 = *(undefined4 *)((long)&pEVar10->dataReference + 2);
  uVar9 = *(undefined4 *)((long)&pEVar10->dataReference + 6);
  *(undefined4 *)&this->fed = *(undefined4 *)&pEVar10->fed;
  *(undefined4 *)((long)&this->fed + 4) = uVar3;
  this->referenceIndex = iVar4;
  *(undefined4 *)&this->field_0x44 = uVar5;
  *(undefined4 *)((long)&this->referenceIndex + 2) = uVar6;
  *(undefined4 *)&this->field_0x46 = uVar7;
  *(undefined4 *)((long)&this->dataReference + 2) = uVar8;
  *(undefined4 *)((long)&this->dataReference + 6) = uVar9;
  (this->defDest)._M_dataplus._M_p = (pointer)&(this->defDest).field_2;
  pcVar2 = (pEVar10->defDest)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->defDest,pcVar2,pcVar2 + (pEVar10->defDest)._M_string_length);
  return;
}

Assistant:

Endpoint::Endpoint(MessageFederate* mFed, std::string_view name, std::string_view type):
    Endpoint(mFed->registerEndpoint(name, type))
{
}